

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::find_data::got_write_token(find_data *this,node_id *n,string *write_token)

{
  uint uVar1;
  dht_observer *pdVar2;
  int iVar3;
  mapped_type *this_00;
  difference_type in_RCX;
  span<const_char> in;
  span<const_char> in_00;
  string local_70;
  string local_50;
  
  pdVar2 = ((this->super_traversal_algorithm).m_node)->m_observer;
  if (pdVar2 != (dht_observer *)0x0) {
    iVar3 = (**(pdVar2->super_dht_logger)._vptr_dht_logger)(pdVar2,4);
    if ((char)iVar3 != '\0') {
      uVar1 = (this->super_traversal_algorithm).m_id;
      in.m_len = in_RCX;
      in.m_ptr = (char *)write_token->_M_string_length;
      aux::to_hex_abi_cxx11_(&local_50,(aux *)(write_token->_M_dataplus)._M_p,in);
      in_00.m_len = in_RCX;
      in_00.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_(&local_70,(aux *)n,in_00);
      (*(pdVar2->super_dht_logger)._vptr_dht_logger[1])
                (pdVar2,4,"[%u] adding write token \'%s\' under id \'%s\'",(ulong)uVar1,
                 local_50._M_dataplus._M_p,local_70._M_dataplus._M_p);
      ::std::__cxx11::string::~string((string *)&local_70);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
  }
  this_00 = ::std::
            map<libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_write_tokens,n);
  ::std::__cxx11::string::operator=((string *)this_00,(string *)write_token);
  return;
}

Assistant:

void find_data::got_write_token(node_id const& n, std::string write_token)
{
#ifndef TORRENT_DISABLE_LOGGING
	auto* logger = get_node().observer();
	if (logger != nullptr && logger->should_log(dht_logger::traversal))
	{
		logger->log(dht_logger::traversal
			, "[%u] adding write token '%s' under id '%s'"
			, id(), aux::to_hex(write_token).c_str()
			, aux::to_hex(n).c_str());
	}
#endif
	m_write_tokens[n] = std::move(write_token);
}